

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNamedNodeMapImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMNamedNodeMapImpl::setReadOnly(DOMNamedNodeMapImpl *this,bool readOnl,bool deep)

{
  XMLSize_t XVar1;
  long *plVar2;
  long lVar3;
  DOMNodeImpl *this_00;
  DOMException *this_01;
  undefined7 in_register_00000011;
  DOMNode *pDVar4;
  long lVar5;
  ulong uVar6;
  
  if ((int)CONCAT71(in_register_00000011,deep) != 0) {
    lVar5 = 0;
    do {
      if ((this->fBuckets[lVar5] != (DOMNodeVector *)0x0) &&
         (XVar1 = this->fBuckets[lVar5]->nextFreeSlot, XVar1 != 0)) {
        uVar6 = 0;
        do {
          if (uVar6 < this->fBuckets[lVar5]->nextFreeSlot) {
            pDVar4 = this->fBuckets[lVar5]->data[uVar6];
          }
          else {
            pDVar4 = (DOMNode *)0x0;
          }
          if (pDVar4 == (DOMNode *)0x0) {
            plVar2 = (long *)0x0;
          }
          else {
            plVar2 = (long *)__dynamic_cast(pDVar4,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                            0xfffffffffffffffe);
          }
          if (plVar2 == (long *)0x0) {
LAB_002788c8:
            this_01 = (DOMException *)__cxa_allocate_exception(0x28);
            DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
            __cxa_throw(this_01,&DOMException::typeinfo,DOMException::~DOMException);
          }
          lVar3 = (**(code **)(*plVar2 + 0x10))(plVar2);
          if (lVar3 == 0) goto LAB_002788c8;
          this_00 = (DOMNodeImpl *)(**(code **)(*plVar2 + 0x10))(plVar2);
          DOMNodeImpl::setReadOnly(this_00,readOnl,true);
          uVar6 = uVar6 + 1;
        } while (XVar1 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xc1);
  }
  return;
}

Assistant:

void DOMNamedNodeMapImpl::setReadOnly(bool readOnl, bool deep)
{
    // this->fReadOnly=readOnl;
    if(deep) {
        for (XMLSize_t index = 0; index < MAP_SIZE; index++) {
            if(fBuckets[index]==0)
                continue;
            XMLSize_t sz = fBuckets[index]->size();
            for (XMLSize_t i=0; i<sz; ++i)
                castToNodeImpl(fBuckets[index]->elementAt(i))->setReadOnly(readOnl, deep);
        }
    }
}